

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

errr Term_clear(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  int *piVar3;
  wchar_t *pwVar4;
  int *piVar5;
  wchar_t *pwVar6;
  wchar_t *scr_tcc;
  int *scr_taa;
  wchar_t *scr_cc;
  int *scr_aa;
  wchar_t h;
  wchar_t w;
  wchar_t y;
  wchar_t x;
  
  wVar1 = Term->wid;
  wVar2 = Term->hgt;
  Term->scr->cu = false;
  Term->scr->cy = 0;
  Term->scr->cx = 0;
  for (h = L'\0'; h < wVar2; h = h + L'\x01') {
    piVar3 = Term->scr->a[h];
    pwVar4 = Term->scr->c[h];
    piVar5 = Term->scr->ta[h];
    pwVar6 = Term->scr->tc[h];
    for (w = L'\0'; w < wVar1; w = w + L'\x01') {
      piVar3[w] = 1;
      pwVar4[w] = L' ';
      piVar5[w] = 0;
      pwVar6[w] = L'\0';
    }
    Term->x1[h] = 0;
    Term->x2[h] = wVar1 + L'\xffffffff';
  }
  Term->y1 = 0;
  Term->y2 = wVar2 + L'\xffffffff';
  Term->total_erase = true;
  return 0;
}

Assistant:

errr Term_clear(void)
{
	int x, y;

	int w = Term->wid;
	int h = Term->hgt;

	/* Cursor usable */
	Term->scr->cu = 0;

	/* Cursor to the top left */
	Term->scr->cx = Term->scr->cy = 0;

	/* Wipe each row */
	for (y = 0; y < h; y++) {
		int *scr_aa = Term->scr->a[y];
		wchar_t *scr_cc = Term->scr->c[y];
		int *scr_taa = Term->scr->ta[y];
		wchar_t *scr_tcc = Term->scr->tc[y];

		/* Wipe each column */
		for (x = 0; x < w; x++) {
			scr_aa[x] = COLOUR_WHITE;
			scr_cc[x] = ' ';

			scr_taa[x] = 0;
			scr_tcc[x] = 0;
		}

		/* This row has changed */
		Term->x1[y] = 0;
		Term->x2[y] = w - 1;
	}

	/* Every row has changed */
	Term->y1 = 0;
	Term->y2 = h - 1;

	/* Force "total erase" */
	Term->total_erase = true;

	/* Success */
	return (0);
}